

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_glsl_op
          (CompilerMSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  bool bVar1;
  uint32_t uVar2;
  BaseType input_type;
  BaseType input_type_00;
  GLSLstd450 GVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  SPIRType *pSVar7;
  char *op_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar8;
  bool local_77a;
  bool local_76a;
  bool local_732;
  bool local_68d;
  undefined1 local_628 [32];
  undefined1 local_608 [44];
  uint32_t tmp_type_id;
  uint32_t *tmp_id;
  char local_5d0;
  bool local_5c1;
  SPIRType *pSStack_5c0;
  bool is_thread_storage;
  SPIRType *type;
  SPIRExpression *ptr;
  SPIRType *exp_type;
  undefined1 local_588 [64];
  undefined1 local_548 [32];
  undefined1 local_528 [64];
  spirv_cross local_4e8 [32];
  char *local_4c8;
  spirv_cross local_4c0 [32];
  undefined1 local_4a0 [64];
  SPIRConstant *local_460;
  SPIRConstant *c_2;
  string local_450 [4];
  uint32_t index_expr_2;
  string component_2;
  undefined1 local_428 [4];
  uint32_t interface_index_2;
  undefined1 local_408 [64];
  spirv_cross local_3c8 [32];
  TypedID<(spirv_cross::Types)0> *local_3a8;
  spirv_cross local_3a0 [32];
  undefined1 local_380 [64];
  SPIRConstant *local_340;
  SPIRConstant *c_1;
  string local_330 [4];
  uint32_t index_expr_1;
  string component_1;
  undefined1 local_308 [4];
  uint32_t interface_index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  spirv_cross local_2c8 [32];
  char *local_2a8;
  spirv_cross local_2a0 [32];
  undefined1 local_280 [64];
  SPIRConstant *local_240;
  SPIRConstant *c;
  string local_230 [4];
  uint32_t index_expr;
  string component;
  uint32_t interface_index;
  SPIRType *mat_type;
  spirv_cross local_1e0 [8];
  string expr_5;
  undefined1 local_1c0 [40];
  string expr_4;
  undefined1 local_178 [4];
  BaseType basetype;
  undefined1 local_158 [40];
  string expr_3;
  undefined1 local_118 [40];
  string expr_2;
  undefined1 local_d8 [40];
  string expr_1;
  undefined1 local_88 [40];
  string expr;
  SPIRType *restype;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  GLSLstd450 op;
  uint32_t count_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  local_18 = id;
  eop_local = result_type;
  _id_local = this;
  uVar2 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  input_type = to_signed_basetype(uVar2);
  input_type_00 = to_unsigned_basetype(uVar2);
  GVar3 = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
  uVar2 = (uint32_t)this;
  switch(GVar3) {
  case GLSLstd450RoundEven:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"rint");
    break;
  default:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    break;
  case GLSLstd450Sinh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_88,uVar2,SUB41(*args,0))
      ;
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                ((spirv_cross *)(local_88 + 0x20),(char (*) [17])"half(fast::sinh(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (char (*) [3])0x41e7bb);
      ::std::__cxx11::string::~string((string *)local_88);
      uVar5 = eop_local;
      uVar2 = local_18;
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,uVar2,(string *)(local_88 + 0x20),bVar1,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      ::std::__cxx11::string::~string((string *)(local_88 + 0x20));
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::sinh");
    }
    break;
  case GLSLstd450Cosh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_((CompilerGLSL *)local_d8,uVar2,SUB41(*args,0))
      ;
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                ((spirv_cross *)(local_d8 + 0x20),(char (*) [17])"half(fast::cosh(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (char (*) [3])0x41e7bb);
      ::std::__cxx11::string::~string((string *)local_d8);
      uVar5 = eop_local;
      uVar2 = local_18;
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,uVar2,(string *)(local_d8 + 0x20),bVar1,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      ::std::__cxx11::string::~string((string *)(local_d8 + 0x20));
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::cosh");
    }
    break;
  case GLSLstd450Tanh:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_118,uVar2,SUB41(*args,0));
      join<char_const(&)[17],std::__cxx11::string,char_const(&)[3]>
                ((spirv_cross *)(local_118 + 0x20),(char (*) [17])"half(fast::tanh(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (char (*) [3])0x41e7bb);
      ::std::__cxx11::string::~string((string *)local_118);
      uVar5 = eop_local;
      uVar2 = local_18;
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,uVar2,(string *)(local_118 + 0x20),bVar1,false);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      ::std::__cxx11::string::~string((string *)(local_118 + 0x20));
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"precise::tanh");
    }
    break;
  case GLSLstd450Atan2:
    if (pSVar7->basetype == Half) {
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_158,uVar2,SUB41(*args,0));
      CompilerGLSL::to_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_178,uVar2,SUB41(args[1],0));
      join<char_const(&)[18],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                ((spirv_cross *)(local_158 + 0x20),(char (*) [18])"half(fast::atan2(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                 (char (*) [3])0x421228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 (char (*) [3])0x41e7bb);
      ::std::__cxx11::string::~string((string *)local_178);
      ::std::__cxx11::string::~string((string *)local_158);
      uVar5 = eop_local;
      uVar2 = local_18;
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      local_68d = false;
      if (bVar1) {
        local_68d = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar5,uVar2,(string *)(local_158 + 0x20),local_68d,false)
      ;
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,args[1]);
      ::std::__cxx11::string::~string((string *)(local_158 + 0x20));
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::atan2");
    }
    break;
  case GLSLstd450Pow:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"powr");
    break;
  case GLSLstd450InverseSqrt:
    CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"rsqrt");
    break;
  case GLSLstd450MatrixInverse:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    uVar2 = pSVar7->columns;
    if (uVar2 == 2) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse2x2");
    }
    else if (uVar2 == 3) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse3x3");
    }
    else if (uVar2 == 4) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvInverse4x4");
    }
    break;
  case GLSLstd450Modf:
  case GLSLstd450Frexp:
    type = (SPIRType *)Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,args[1]);
    pSStack_5c0 = Compiler::expression_type((Compiler *)this,args[1]);
    local_5c1 = storage_class_array_is_thread(pSStack_5c0->storage);
    if ((pSStack_5c0->storage == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) != 0)
       ) {
      local_5c1 = false;
    }
    if (local_5c1 == false) {
LAB_002e12f0:
      CompilerGLSL::register_call_out_argument(&this->super_CompilerGLSL,args[1]);
      pVar8 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries,&local_18);
      tmp_id = (uint32_t *)pVar8.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_5d0 = pVar8.second;
      register0x00000000 =
           (Variant *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&(this->super_CompilerGLSL).extra_sub_expressions,&local_18);
      if (*(mapped_type *)&register0x00000000->group == 0) {
        uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        *(uint32_t *)&stack0xfffffffffffffa20->group = uVar5;
      }
      uVar5 = Compiler::expression_type_id((Compiler *)this,args[1]);
      local_608._36_4_ = Compiler::get_pointee_type_id((Compiler *)this,uVar5);
      CompilerGLSL::emit_uninitialized_temporary_expression
                (&this->super_CompilerGLSL,local_608._36_4_,
                 *(uint32_t *)&stack0xfffffffffffffa20->group);
      op_00 = "frexp";
      if (eop == 0x23) {
        op_00 = "modf";
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,
                 *(uint32_t *)&stack0xfffffffffffffa20->group,op_00);
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_608,uVar2,SUB41(args[1],0));
      CompilerGLSL::to_expression_abi_cxx11_
                ((CompilerGLSL *)local_628,uVar2,
                 SUB41(*(mapped_type *)&stack0xfffffffffffffa20->group,0));
      CompilerGLSL::
      statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                 (char (*) [4])0x4247a7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_628,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_628);
      ::std::__cxx11::string::~string((string *)local_608);
    }
    else {
      if ((type != (SPIRType *)0x0) && (((type->array).stack_storage.aligned_char[2] & 1U) != 0)) {
        pSVar7 = Compiler::expression_type((Compiler *)this,args[1]);
        bVar1 = Compiler::is_scalar((Compiler *)this,pSVar7);
        if (bVar1) goto LAB_002e12f0;
      }
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450FMin:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"fast::min");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"min");
    }
    break;
  case GLSLstd450FMax:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"fast::max");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"max");
    }
    break;
  case GLSLstd450FClamp:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"fast::clamp");
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"clamp");
    }
    break;
  case GLSLstd450PackSnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_snorm4x8");
    break;
  case GLSLstd450PackUnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_unorm4x8");
    break;
  case GLSLstd450PackSnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_snorm2x16");
    break;
  case GLSLstd450PackUnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"pack_float_to_unorm2x16");
    break;
  case GLSLstd450PackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_1c0,uVar2,SUB41(*args,0));
    join<char_const(&)[21],std::__cxx11::string,char_const(&)[3]>
              ((spirv_cross *)(local_1c0 + 0x20),(char (*) [21])"as_type<uint>(half2(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
               (char (*) [3])0x41e7bb);
    ::std::__cxx11::string::~string((string *)local_1c0);
    uVar5 = eop_local;
    uVar2 = local_18;
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,uVar5,uVar2,(string *)(local_1c0 + 0x20),bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
    ::std::__cxx11::string::~string((string *)(local_1c0 + 0x20));
    break;
  case GLSLstd450PackDouble2x32:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,
               "unsupported_GLSLstd450PackDouble2x32");
    break;
  case GLSLstd450UnpackSnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_snorm2x16_to_float");
    break;
  case GLSLstd450UnpackUnorm2x16:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_unorm2x16_to_float");
    break;
  case GLSLstd450UnpackHalf2x16:
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)&mat_type,uVar2,SUB41(*args,0));
    join<char_const(&)[23],std::__cxx11::string,char_const(&)[3]>
              (local_1e0,(char (*) [23])"float2(as_type<half2>(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat_type,
               (char (*) [3])0x41e7bb);
    ::std::__cxx11::string::~string((string *)&mat_type);
    uVar5 = eop_local;
    uVar2 = local_18;
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar2,(string *)local_1e0,bVar1,false);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
    ::std::__cxx11::string::~string((string *)local_1e0);
    break;
  case GLSLstd450UnpackSnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_snorm4x8_to_float");
    break;
  case GLSLstd450UnpackUnorm4x8:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"unpack_unorm4x8_to_float");
    break;
  case GLSLstd450UnpackDouble2x32:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,eop_local,local_18,*args,
               "unsupported_GLSLstd450UnpackDouble2x32");
    break;
  case GLSLstd450Length:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"abs");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Distance:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    uVar4 = eop_local;
    uVar5 = local_18;
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)local_588,uVar2,SUB41(*args,0));
      CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                ((CompilerGLSL *)&exp_type,uVar2,SUB41(args[1],0));
      join<char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                ((spirv_cross *)(local_588 + 0x20),(char (*) [5])"abs(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588,
                 (char (*) [4])0x41078f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_type,
                 (char (*) [2])0x40bd22);
      bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
      local_77a = false;
      if (bVar1) {
        local_77a = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
      }
      CompilerGLSL::emit_op
                (&this->super_CompilerGLSL,uVar4,uVar5,(string *)(local_588 + 0x20),local_77a,false)
      ;
      ::std::__cxx11::string::~string((string *)(local_588 + 0x20));
      ::std::__cxx11::string::~string((string *)&exp_type);
      ::std::__cxx11::string::~string((string *)local_588);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,*args);
      Compiler::inherit_expression_dependencies((Compiler *)this,local_18,args[1]);
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Normalize:
    ptr = (SPIRExpression *)Compiler::expression_type((Compiler *)this,*args);
    if (((SPIRType *)ptr)->vecsize == 1) {
      CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,eop_local,local_18,*args,"sign");
    }
    else if ((((SPIRType *)ptr)->vecsize < 4) && (((SPIRType *)ptr)->basetype == Half)) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"normalize");
    }
    else {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,"fast::normalize");
    }
    break;
  case GLSLstd450FaceForward:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"spvFaceForward"
                );
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Reflect:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"spvReflect");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450Refract:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->vecsize == 1) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"spvRefract");
    }
    else {
      CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,eop_local,local_18,eop,args,count);
    }
    break;
  case GLSLstd450FindILsb:
    pSVar7 = Compiler::expression_type((Compiler *)this,*args);
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindLSB",pSVar7->basetype,
               pSVar7->basetype);
    break;
  case GLSLstd450FindSMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindSMSB",input_type,
               input_type);
    break;
  case GLSLstd450FindUMsb:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,eop_local,local_18,*args,"spvFindUMSB",input_type_00,
               input_type_00);
    break;
  case GLSLstd450InterpolateAtCentroid:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_230);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c._4_4_ = Compiler::get_extended_decoration
                          ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_240 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c._4_4_);
      if ((local_240 == (SPIRConstant *)0x0) || ((local_240->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_280,uVar2,SUB41(c._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_280 + 0x20),(char (*) [2])0x40f992,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (char (*) [2])0x40f897);
        ::std::__cxx11::string::operator=(local_230,(string *)(local_280 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_280 + 0x20));
        ::std::__cxx11::string::~string((string *)local_280);
      }
      else {
        uVar2 = SPIRConstant::scalar(local_240,0,0);
        local_2a8 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar2);
        join<char_const(&)[2],char_const*>(local_2a0,(char (*) [2])0x40b926,&local_2a8);
        ::std::__cxx11::string::operator=(local_230,(string *)local_2a0);
        ::std::__cxx11::string::~string((string *)local_2a0);
      }
    }
    uVar5 = eop_local;
    uVar2 = local_18;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_2e8,this,(ulong)uVar4,1);
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_308,(SPIRType *)this,(uint32_t)pSVar7);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[27],std::__cxx11::string&>
              (local_2c8,local_2e8,(char (*) [2])0x40b926,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
               (char (*) [27])".interpolate_at_centroid()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar2,(string *)local_2c8,bVar1,false);
    ::std::__cxx11::string::~string((string *)local_2c8);
    ::std::__cxx11::string::~string((string *)local_308);
    ::std::__cxx11::string::~string((string *)local_2e8);
    ::std::__cxx11::string::~string(local_230);
    break;
  case GLSLstd450InterpolateAtSample:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_330);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c_1._4_4_ = Compiler::get_extended_decoration
                            ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_340 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c_1._4_4_);
      if ((local_340 == (SPIRConstant *)0x0) || ((local_340->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_380,uVar2,SUB41(c_1._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_380 + 0x20),(char (*) [2])0x40f992,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
                   (char (*) [2])0x40f897);
        ::std::__cxx11::string::operator=(local_330,(string *)(local_380 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_380 + 0x20));
        ::std::__cxx11::string::~string((string *)local_380);
      }
      else {
        uVar5 = SPIRConstant::scalar(local_340,0,0);
        local_3a8 = (TypedID<(spirv_cross::Types)0> *)
                    CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar5);
        join<char_const(&)[2],char_const*>(local_3a0,(char (*) [2])0x40b926,(char **)&local_3a8);
        ::std::__cxx11::string::operator=(local_330,(string *)local_3a0);
        ::std::__cxx11::string::~string((string *)local_3a0);
      }
    }
    uVar4 = eop_local;
    uVar5 = local_18;
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_408 + 0x20,this,(ulong)uVar6,1);
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_408,(SPIRType *)this,(uint32_t)pSVar7);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_428,uVar2,SUB41(args[1],0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (local_3c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_408 + 0x20),(char (*) [2])0x40b926,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
               (char (*) [24])".interpolate_at_sample(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
               (char (*) [2])0x40bd22,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    local_732 = false;
    if (bVar1) {
      local_732 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,uVar5,(string *)local_3c8,local_732,false)
    ;
    ::std::__cxx11::string::~string((string *)local_3c8);
    ::std::__cxx11::string::~string((string *)local_428);
    ::std::__cxx11::string::~string((string *)local_408);
    ::std::__cxx11::string::~string((string *)(local_408 + 0x20));
    ::std::__cxx11::string::~string(local_330);
    break;
  case GLSLstd450InterpolateAtOffset:
    Compiler::get_extended_decoration
              ((Compiler *)this,*args,SPIRVCrossDecorationInterfaceMemberIndex);
    ::std::__cxx11::string::string(local_450);
    bVar1 = Compiler::has_extended_decoration
                      ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
    if (bVar1) {
      c_2._4_4_ = Compiler::get_extended_decoration
                            ((Compiler *)this,*args,SPIRVCrossDecorationInterpolantComponentExpr);
      local_460 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,c_2._4_4_);
      if ((local_460 == (SPIRConstant *)0x0) || ((local_460->specialization & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_4a0,uVar2,SUB41(c_2._4_4_,0));
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  ((spirv_cross *)(local_4a0 + 0x20),(char (*) [2])0x40f992,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                   (char (*) [2])0x40f897);
        ::std::__cxx11::string::operator=(local_450,(string *)(local_4a0 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_4a0 + 0x20));
        ::std::__cxx11::string::~string((string *)local_4a0);
      }
      else {
        uVar5 = SPIRConstant::scalar(local_460,0,0);
        local_4c8 = CompilerGLSL::index_to_swizzle(&this->super_CompilerGLSL,uVar5);
        join<char_const(&)[2],char_const*>(local_4c0,(char (*) [2])0x40b926,&local_4c8);
        ::std::__cxx11::string::operator=(local_450,(string *)local_4c0);
        ::std::__cxx11::string::~string((string *)local_4c0);
      }
    }
    uVar4 = eop_local;
    uVar5 = local_18;
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_528 + 0x20,this,(ulong)uVar6,1);
    pSVar7 = get_stage_in_struct_type(this);
    CompilerGLSL::to_member_name_abi_cxx11_
              ((CompilerGLSL *)local_528,(SPIRType *)this,(uint32_t)pSVar7);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_548,uVar2,SUB41(args[1],0));
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[24],std::__cxx11::string,char_const(&)[11],std::__cxx11::string&>
              (local_4e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_528 + 0x20),(char (*) [2])0x40b926,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528,
               (char (*) [24])".interpolate_at_offset(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548,
               (char (*) [11])" + 0.4375)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
    bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,*args);
    local_76a = false;
    if (bVar1) {
      local_76a = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[1]);
    }
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar4,uVar5,(string *)local_4e8,local_76a,false)
    ;
    ::std::__cxx11::string::~string((string *)local_4e8);
    ::std::__cxx11::string::~string((string *)local_548);
    ::std::__cxx11::string::~string((string *)local_528);
    ::std::__cxx11::string::~string((string *)(local_528 + 0x20));
    ::std::__cxx11::string::~string(local_450);
    break;
  case GLSLstd450NMin:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::min");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"min");
    }
    break;
  case GLSLstd450NMax:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"precise::max");
    }
    else {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],"max");
    }
    break;
  case GLSLstd450NClamp:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,eop_local);
    if (pSVar7->basetype == Float) {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"precise::clamp"
                );
    }
    else {
      CompilerGLSL::emit_trinary_func_op
                (&this->super_CompilerGLSL,eop_local,local_18,*args,args[1],args[2],"clamp");
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	auto &restype = get<SPIRType>(result_type);

	switch (op)
	{
	case GLSLstd450Sinh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::sinh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::sinh");
		break;
	case GLSLstd450Cosh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::cosh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "fast::cosh");
		break;
	case GLSLstd450Tanh:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::tanh(", to_unpacked_expression(args[0]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]));
			inherit_expression_dependencies(id, args[0]);
		}
		else
			emit_unary_func_op(result_type, id, args[0], "precise::tanh");
		break;
	case GLSLstd450Atan2:
		if (restype.basetype == SPIRType::Half)
		{
			// MSL does not have overload for half. Force-cast back to half.
			auto expr = join("half(fast::atan2(", to_unpacked_expression(args[0]), ", ", to_unpacked_expression(args[1]), "))");
			emit_op(result_type, id, expr, should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::atan2");
		break;
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;
	case GLSLstd450RoundEven:
		emit_unary_func_op(result_type, id, args[0], "rint");
		break;

	case GLSLstd450FindILsb:
	{
		// In this template version of findLSB, we return T.
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindLSB", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindSMSB", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "spvFindUMSB", uint_type, uint_type);
		break;

	case GLSLstd450PackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm4x8");
		break;
	case GLSLstd450PackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm4x8");
		break;
	case GLSLstd450PackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_snorm2x16");
		break;
	case GLSLstd450PackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "pack_float_to_unorm2x16");
		break;

	case GLSLstd450PackHalf2x16:
	{
		auto expr = join("as_type<uint>(half2(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450UnpackSnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm4x8_to_float");
		break;
	case GLSLstd450UnpackUnorm4x8:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm4x8_to_float");
		break;
	case GLSLstd450UnpackSnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_snorm2x16_to_float");
		break;
	case GLSLstd450UnpackUnorm2x16:
		emit_unary_func_op(result_type, id, args[0], "unpack_unorm2x16_to_float");
		break;

	case GLSLstd450UnpackHalf2x16:
	{
		auto expr = join("float2(as_type<half2>(", to_expression(args[0]), "))");
		emit_op(result_type, id, expr, should_forward(args[0]));
		inherit_expression_dependencies(id, args[0]);
		break;
	}

	case GLSLstd450PackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450PackDouble2x32"); // Currently unsupported
		break;
	case GLSLstd450UnpackDouble2x32:
		emit_unary_func_op(result_type, id, args[0], "unsupported_GLSLstd450UnpackDouble2x32"); // Currently unsupported
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &mat_type = get<SPIRType>(result_type);
		switch (mat_type.columns)
		{
		case 2:
			emit_unary_func_op(result_type, id, args[0], "spvInverse2x2");
			break;
		case 3:
			emit_unary_func_op(result_type, id, args[0], "spvInverse3x3");
			break;
		case 4:
			emit_unary_func_op(result_type, id, args[0], "spvInverse4x4");
			break;
		default:
			break;
		}
		break;
	}

	case GLSLstd450FMin:
		// If the result type isn't float, don't bother calling the specific
		// precise::/fast:: version. Metal doesn't have those for half and
		// double types.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::min");
		break;

	case GLSLstd450FMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "fast::max");
		break;

	case GLSLstd450FClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "fast::clamp");
		break;

	case GLSLstd450NMin:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "min");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::min");
		break;

	case GLSLstd450NMax:
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_binary_func_op(result_type, id, args[0], args[1], "max");
		else
			emit_binary_func_op(result_type, id, args[0], args[1], "precise::max");
		break;

	case GLSLstd450NClamp:
		// TODO: If args[1] is 0 and args[2] is 1, emit a saturate() call.
		if (get<SPIRType>(result_type).basetype != SPIRType::Float)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "clamp");
		else
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "precise::clamp");
		break;

	case GLSLstd450InterpolateAtCentroid:
	{
		// We can't just emit the expression normally, because the qualified name contains a call to the default
		// interpolate method, or refers to a local variable. We saved the interface index we need; use it to construct
		// the base for the method call.
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_centroid()", component),
		        should_forward(args[0]));
		break;
	}

	case GLSLstd450InterpolateAtSample:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_sample(", to_expression(args[1]), ")", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450InterpolateAtOffset:
	{
		uint32_t interface_index = get_extended_decoration(args[0], SPIRVCrossDecorationInterfaceMemberIndex);
		string component;
		if (has_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr))
		{
			uint32_t index_expr = get_extended_decoration(args[0], SPIRVCrossDecorationInterpolantComponentExpr);
			auto *c = maybe_get<SPIRConstant>(index_expr);
			if (!c || c->specialization)
				component = join("[", to_expression(index_expr), "]");
			else
				component = join(".", index_to_swizzle(c->scalar()));
		}
		// Like Direct3D, Metal puts the (0, 0) at the upper-left corner, not the center as SPIR-V and GLSL do.
		// Offset the offset by (1/2 - 1/16), or 0.4375, to compensate for this.
		// It has to be (1/2 - 1/16) and not 1/2, or several CTS tests subtly break on Intel.
		emit_op(result_type, id,
		        join(to_name(stage_in_var_id), ".", to_member_name(get_stage_in_struct_type(), interface_index),
		             ".interpolate_at_offset(", to_expression(args[1]), " + 0.4375)", component),
		        should_forward(args[0]) && should_forward(args[1]));
		break;
	}

	case GLSLstd450Distance:
		// MSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Equivalent to length(a - b) -> abs(a - b).
			emit_op(result_type, id,
			        join("abs(", to_enclosed_unpacked_expression(args[0]), " - ",
			             to_enclosed_unpacked_expression(args[1]), ")"),
			        should_forward(args[0]) && should_forward(args[1]));
			inherit_expression_dependencies(id, args[0]);
			inherit_expression_dependencies(id, args[1]);
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Length:
		// MSL does not support scalar versions, so use abs().
		if (expression_type(args[0]).vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "abs");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Normalize:
	{
		auto &exp_type = expression_type(args[0]);
		// MSL does not support scalar versions here.
		// MSL has no implementation for normalize in the fast:: namespace for half2 and half3
		// Returns -1 or 1 for valid input, sign() does the job.
		if (exp_type.vecsize == 1)
			emit_unary_func_op(result_type, id, args[0], "sign");
		else if (exp_type.vecsize <= 3 && exp_type.basetype == SPIRType::Half)
			emit_unary_func_op(result_type, id, args[0], "normalize");
		else
			emit_unary_func_op(result_type, id, args[0], "fast::normalize");
		break;
	}
	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Modf:
	case GLSLstd450Frexp:
	{
		// Special case. If the variable is a scalar access chain, we cannot use it directly. We have to emit a temporary.
		// Another special case is if the variable is in a storage class which is not thread.
		auto *ptr = maybe_get<SPIRExpression>(args[1]);
		auto &type = expression_type(args[1]);

		bool is_thread_storage = storage_class_array_is_thread(type.storage);
		if (type.storage == StorageClassOutput && capture_output_to_buffer)
			is_thread_storage = false;

		if (!is_thread_storage ||
		    (ptr && ptr->access_chain && is_scalar(expression_type(args[1]))))
		{
			register_call_out_argument(args[1]);
			forced_temporaries.insert(id);

			// Need to create temporaries and copy over to access chain after.
			// We cannot directly take the reference of a vector swizzle in MSL, even if it's scalar ...
			uint32_t &tmp_id = extra_sub_expressions[id];
			if (!tmp_id)
				tmp_id = ir.increase_bound_by(1);

			uint32_t tmp_type_id = get_pointee_type_id(expression_type_id(args[1]));
			emit_uninitialized_temporary_expression(tmp_type_id, tmp_id);
			emit_binary_func_op(result_type, id, args[0], tmp_id, eop == GLSLstd450Modf ? "modf" : "frexp");
			statement(to_expression(args[1]), " = ", to_expression(tmp_id), ";");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}

	case GLSLstd450Pow:
		// powr makes x < 0.0 undefined, just like SPIR-V.
		emit_binary_func_op(result_type, id, args[0], args[1], "powr");
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}